

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O0

ASTNode * ParseFuncCall(Scope *scope,Lexer *lexer)

{
  Token tok_00;
  char *pcVar1;
  ASTNode *pAVar2;
  ASTNode *pAVar3;
  ASTList *pAVar4;
  ASTNode *funcCall;
  Token tok;
  Lexer *lexer_local;
  Scope *scope_local;
  
  tok_00 = GetCurrentToken(lexer);
  if (tok_00 != IDENTIFIER) {
    pcVar1 = TokenToString(tok_00);
    printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","IDENTIFIER",pcVar1,
           (ulong)(uint)(lexer->tracker).row,
           (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
    exit(0);
  }
  pAVar2 = GetNextNode(scope);
  pAVar2->type = FUNC_CALL;
  pAVar3 = FindSymbol(scope,lexer->currentTokenString);
  (pAVar2->meta).binaryExpr.left = pAVar3;
  pAVar2->isStmt = true;
  pAVar4 = ParseArgs(scope,lexer);
  (pAVar2->meta).funcCallExpr.args = pAVar4;
  return pAVar2;
}

Assistant:

ASTNode* ParseFuncCall(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Func Call");
	TRACK();
	Token tok = GetCurrentToken(lexer);
	EXPECT_TOKEN(tok, IDENTIFIER, lexer);

	ASTNode* funcCall = GetNextNode(scope);
	SET_NODE_TYPE(funcCall, FUNC_CALL);
	SET_FUNC_CALL_FUNC(funcCall, FindSymbol(scope, lexer->currentTokenString));
	SET_IS_STMT(funcCall);
	SET_FUNC_CALL_ARGS(funcCall, ParseArgs(scope, lexer));
	return funcCall;
}